

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFindPackageCommand::CheckVersion(cmFindPackageCommand *this,string *config_file)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  undefined1 local_e0 [8];
  ConfigFileInfo configFileInfo;
  string version_file;
  string version_file_base;
  size_type pos;
  allocator local_41;
  undefined1 local_40 [8];
  string version;
  bool haveResult;
  bool result;
  string *config_file_local;
  cmFindPackageCommand *this_local;
  
  version.field_2._M_local_buf[0xf] = '\0';
  version.field_2._M_local_buf[0xe] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"unknown",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::string::rfind((char)config_file,0x2e);
  std::__cxx11::string::substr((ulong)((long)&version_file.field_2 + 8),(ulong)config_file);
  std::__cxx11::string::string
            ((string *)(configFileInfo.version.field_2._M_local_buf + 8),
             (string *)(version_file.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=
            ((string *)(configFileInfo.version.field_2._M_local_buf + 8),"-version.cmake");
  if ((version.field_2._M_local_buf[0xe] & 1U) == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar3,true);
    if (bVar2) {
      version.field_2._M_local_buf[0xf] =
           CheckVersionFile(this,(string *)((long)&configFileInfo.version.field_2 + 8),
                            (string *)local_40);
      version.field_2._M_local_buf[0xe] = '\x01';
    }
  }
  std::__cxx11::string::operator=
            ((string *)(configFileInfo.version.field_2._M_local_buf + 8),
             (string *)(version_file.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=
            ((string *)(configFileInfo.version.field_2._M_local_buf + 8),"Version.cmake");
  if ((version.field_2._M_local_buf[0xe] & 1U) == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar3,true);
    if (bVar2) {
      version.field_2._M_local_buf[0xf] =
           CheckVersionFile(this,(string *)((long)&configFileInfo.version.field_2 + 8),
                            (string *)local_40);
      version.field_2._M_local_buf[0xe] = '\x01';
    }
  }
  if (((version.field_2._M_local_buf[0xe] & 1U) == 0) &&
     (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) {
    version.field_2._M_local_buf[0xf] = '\x01';
  }
  ConfigFileInfo::ConfigFileInfo((ConfigFileInfo *)local_e0);
  std::__cxx11::string::operator=((string *)local_e0,(string *)config_file);
  std::__cxx11::string::operator=
            ((string *)(configFileInfo.filename.field_2._M_local_buf + 8),(string *)local_40);
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::push_back(&this->ConsideredConfigs,(value_type *)local_e0);
  uVar1 = version.field_2._M_local_buf[0xf];
  ConfigFileInfo::~ConfigFileInfo((ConfigFileInfo *)local_e0);
  std::__cxx11::string::~string((string *)(configFileInfo.version.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(version_file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(uVar1 & 1);
}

Assistant:

bool cmFindPackageCommand::CheckVersion(std::string const& config_file)
{
  bool result = false; // by default, assume the version is not ok.
  bool haveResult = false;
  std::string version = "unknown";

  // Get the filename without the .cmake extension.
  std::string::size_type pos = config_file.rfind('.');
  std::string version_file_base = config_file.substr(0, pos);

  // Look for foo-config-version.cmake
  std::string version_file = version_file_base;
  version_file += "-version.cmake";
  if ((haveResult == false)
       && (cmSystemTools::FileExists(version_file.c_str(), true)))
    {
    result = this->CheckVersionFile(version_file, version);
    haveResult = true;
    }

  // Look for fooConfigVersion.cmake
  version_file = version_file_base;
  version_file += "Version.cmake";
  if ((haveResult == false)
       && (cmSystemTools::FileExists(version_file.c_str(), true)))
    {
    result = this->CheckVersionFile(version_file, version);
    haveResult = true;
    }


  // If no version was requested a versionless package is acceptable.
  if ((haveResult == false) && (this->Version.empty()))
    {
    result = true;
    }

  ConfigFileInfo configFileInfo;
  configFileInfo.filename = config_file;
  configFileInfo.version = version;
  this->ConsideredConfigs.push_back(configFileInfo);

  return result;
}